

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

uint16_t parseNumber(char **string,char *errPrefix,uint16_t errVal)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  bool bVar12;
  
  pbVar1 = (byte *)*string;
  bVar4 = *pbVar1;
  iVar7 = 0x10;
  lVar8 = 1;
  iVar9 = 10;
  pcVar11 = "";
  bVar2 = true;
  bVar3 = false;
  if (bVar4 < 0x25) {
    bVar12 = false;
    if (bVar4 == 0x24) goto LAB_00105e6e;
    if (bVar4 == 0) {
      error("%s: expected number, but found nothing",errPrefix);
      return errVal;
    }
  }
  else if (bVar4 == 0x25) {
LAB_00105e69:
    iVar7 = 2;
    bVar12 = true;
LAB_00105e6e:
    bVar2 = bVar12;
    iVar9 = iVar7;
    *string = (char *)(pbVar1 + lVar8);
    pcVar11 = " after base";
    bVar3 = bVar2;
  }
  else {
    bVar3 = false;
    if (bVar4 == 0x30) {
      bVar4 = pbVar1[1];
      lVar8 = 2;
      bVar3 = false;
      bVar12 = bVar3;
      if (bVar4 < 0x62) {
        if (bVar4 == 0x42) goto LAB_00105e69;
        if (bVar4 == 0x58) goto LAB_00105e6e;
      }
      else {
        if (bVar4 == 0x78) goto LAB_00105e6e;
        if (bVar4 == 0x62) goto LAB_00105e69;
      }
    }
  }
  bVar4 = **string - 0x30;
  if (!(bool)(bVar3 & 1 < bVar4)) {
    bVar12 = 9 < bVar4;
    if (bVar12 && !bVar2) {
      iVar7 = tolower((uint)(byte)**string);
      if (5 < (iVar7 + 0x9fU & 0xfe)) goto LAB_00105fd3;
      bVar12 = (char)iVar7 == 'V';
    }
    if (!bVar12) {
      uVar10 = 0;
      while( true ) {
        pbVar1 = (byte *)*string;
        bVar4 = *pbVar1;
        bVar5 = bVar4 - 0x30;
        bVar6 = 0xff;
        if (!(bool)(bVar3 & 1 < bVar5)) {
          bVar6 = bVar4 - 0x30;
          if (9 < bVar5) {
            bVar6 = 0xff;
          }
          if ((9 < bVar5 && !bVar2) &&
             (iVar7 = tolower((uint)bVar4), bVar6 = 0xff, (iVar7 + 0x9fU & 0xfe) < 6)) {
            bVar6 = (char)iVar7 + 0xa9;
          }
        }
        if (bVar6 == 0xff) {
          iVar7 = 2;
        }
        else {
          *string = (char *)(pbVar1 + 1);
          uVar10 = uVar10 * iVar9 + (uint)bVar6;
          iVar7 = 0;
          if ((uint)(0xffff / (ulong)(byte)iVar9) <= (uVar10 & 0xffff)) {
            error("%s: the number is too large!",errPrefix);
            iVar7 = 1;
          }
        }
        if (iVar7 != 0) break;
        if (**string == '\0') {
          return (uint16_t)uVar10;
        }
      }
      if (iVar7 == 2) {
        return (uint16_t)uVar10;
      }
      return errVal;
    }
  }
LAB_00105fd3:
  error("%s: expected digit%s, but found nothing",errPrefix,pcVar11);
  return errVal;
}

Assistant:

static uint16_t parseNumber(char *&string, char const *errPrefix, uint16_t errVal = UINT16_MAX) {
	uint8_t base = 10;
	if (*string == '\0') {
		error("%s: expected number, but found nothing", errPrefix);
		return errVal;
	} else if (*string == '$') {
		base = 16;
		++string;
	} else if (*string == '%') {
		base = 2;
		++string;
	} else if (*string == '0' && string[1] != '\0') {
		// Check if we have a "0x" or "0b" here
		if (string[1] == 'x' || string[1] == 'X') {
			base = 16;
			string += 2;
		} else if (string[1] == 'b' || string[1] == 'B') {
			base = 2;
			string += 2;
		}
	}

	/*
	 * Turns a digit into its numeric value in the current base, if it has one.
	 * Maximum is inclusive. The string_view is modified to "consume" all digits.
	 * Returns 255 on parse failure (including wrong char for base), in which case
	 * the string_view may be pointing on garbage.
	 */
	auto charIndex = [&base](unsigned char c) -> uint8_t {
		unsigned char index = c - '0'; // Use wrapping semantics
		if (base == 2 && index >= 2) {
			return 255;
		} else if (index < 10) {
			return index;
		} else if (base != 16) {
			return 255; // Letters are only valid in hex
		}
		index = tolower(c) - 'a'; // OK because we pass an `unsigned char`
		if (index < 6) {
			return index + 10;
		}
		return 255;
	};

	if (charIndex(*string) == 255) {
		error("%s: expected digit%s, but found nothing", errPrefix,
		      base != 10 ? " after base" : "");
		return errVal;
	}
	uint16_t number = 0;
	do {
		// Read a character, and check if it's valid in the given base
		uint8_t index = charIndex(*string);
		if (index == 255) {
			break; // Found an invalid character, end
		}
		++string;

		number *= base;
		number += index;
		// The lax check covers the addition on top of the multiplication
		if (number >= UINT16_MAX / base) {
			error("%s: the number is too large!", errPrefix);
			return errVal;
		}
	} while (*string != '\0'); // No more characters?

	return number;
}